

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int jsondec_rawpeek(jsondec *d)

{
  jsondec *d_local;
  
  if (d->ptr != d->end) {
    switch(*d->ptr) {
    case '\"':
      d_local._4_4_ = 2;
      break;
    default:
      jsondec_errf(d,"Unexpected character: \'%c\'",(ulong)(uint)(int)*d->ptr);
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      d_local._4_4_ = 3;
      break;
    case '[':
      d_local._4_4_ = 1;
      break;
    case 'f':
      d_local._4_4_ = 5;
      break;
    case 'n':
      d_local._4_4_ = 6;
      break;
    case 't':
      d_local._4_4_ = 4;
      break;
    case '{':
      d_local._4_4_ = 0;
    }
    return d_local._4_4_;
  }
  jsondec_err(d,"Unexpected EOF");
}

Assistant:

static int jsondec_rawpeek(jsondec* d) {
  if (d->ptr == d->end) {
    jsondec_err(d, "Unexpected EOF");
  }

  switch (*d->ptr) {
    case '{':
      return JD_OBJECT;
    case '[':
      return JD_ARRAY;
    case '"':
      return JD_STRING;
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      return JD_NUMBER;
    case 't':
      return JD_TRUE;
    case 'f':
      return JD_FALSE;
    case 'n':
      return JD_NULL;
    default:
      jsondec_errf(d, "Unexpected character: '%c'", *d->ptr);
  }
}